

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O0

void prt_map(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  chunk_conflict *c_00;
  _Bool _Var12;
  loc_conflict grid;
  loc grid_00;
  uint uVar13;
  uint uVar14;
  wchar_t clipy;
  wchar_t tx;
  wchar_t ty;
  wchar_t vx;
  wchar_t vy;
  wchar_t x;
  wchar_t y;
  grid_data g;
  wchar_t tc;
  wchar_t c;
  wchar_t ta;
  wchar_t a;
  
  prt_map_aux();
  iVar1 = Term->offset_y;
  iVar2 = Term->hgt;
  iVar3 = row_top_map[Term->sidebar_mode];
  iVar4 = row_bottom_map[Term->sidebar_mode];
  uVar13 = (uint)tile_height;
  iVar5 = Term->offset_x;
  iVar6 = Term->wid;
  iVar7 = col_map[Term->sidebar_mode];
  uVar14 = (uint)tile_width;
  iVar8 = row_top_map[Term->sidebar_mode];
  iVar9 = Term->hgt;
  iVar10 = row_top_map[Term->sidebar_mode];
  iVar11 = row_bottom_map[Term->sidebar_mode];
  ty = row_top_map[Term->sidebar_mode];
  for (vy = Term->offset_y; vy < iVar1 + ((iVar2 - iVar3) - iVar4) / (int)uVar13; vy = vy + L'\x01')
  {
    tx = col_map[Term->sidebar_mode];
    for (vx = Term->offset_x; c_00 = cave, vx < iVar5 + ((iVar6 - iVar7) + -1) / (int)uVar14;
        vx = vx + L'\x01') {
      grid = (loc_conflict)loc(vx,vy);
      _Var12 = square_in_bounds((chunk *)c_00,grid);
      if (_Var12) {
        grid_00 = loc(vx,vy);
        map_info(grid_00,(grid_data *)&x);
        grid_data_as_text((grid_data *)&x,&c,(wchar_t *)&g.field_0x24,&tc,(wchar_t *)&g.in_view);
        Term_queue_char(Term,tx,ty,c,g._36_4_,tc,g._32_4_);
        if ((1 < tile_width) || (1 < tile_height)) {
          Term_big_queue_char(Term,tx,ty,iVar8 + ((iVar9 - iVar10) - iVar11),c,g._36_4_,L'\x01',L' '
                             );
        }
      }
      tx = (uint)tile_width + tx;
    }
    ty = (uint)tile_height + ty;
  }
  return;
}

Assistant:

void prt_map(void)
{
	int a, ta;
	wchar_t c, tc;
	struct grid_data g;

	int y, x;
	int vy, vx;
	int ty, tx;
	int clipy;

	/* Redraw map sub-windows */
	prt_map_aux();

	/* Assume screen */
	ty = Term->offset_y + SCREEN_HGT;
	tx = Term->offset_x + SCREEN_WID;

	/* Avoid overwriting the last row with padding for big tiles. */
	clipy = ROW_MAP + SCREEN_ROWS;

	/* Dump the map */
	for (y = Term->offset_y, vy = ROW_MAP; y < ty; vy += tile_height, y++)
		for (x = Term->offset_x, vx = COL_MAP; x < tx; vx += tile_width, x++) {
			/* Check bounds */
			if (!square_in_bounds(cave, loc(x, y))) continue;

			/* Determine what is there */
			map_info(loc(x, y), &g);
			grid_data_as_text(&g, &a, &c, &ta, &tc);

			/* Hack -- Queue it */
			Term_queue_char(Term, vx, vy, a, c, ta, tc);

			if ((tile_width > 1) || (tile_height > 1))
				Term_big_queue_char(Term, vx, vy, clipy, a, c,
					COLOUR_WHITE, L' ');
		}
}